

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_Mesh::Append(ON_Mesh *this,int mesh_count,ON_Mesh **meshes)

{
  ON_3fVectorArray *pOVar1;
  ON_2fPointArray *this_00;
  ON_2dPointArray *this_01;
  ON_SimpleArray<ON_SurfaceCurvature> *this_02;
  ON_SimpleArray<ON_Color> *this_03;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_Mesh *pOVar6;
  ON_MeshParameters *pOVar7;
  ON_MeshCurvatureStats *this_04;
  ON_TextureCoordinates *pOVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint *puVar14;
  ON_Interval *pOVar15;
  ulong uVar16;
  ON_MeshNgon *pOVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  ON_Interval *pOVar21;
  size_t new_capacity;
  int *piVar22;
  bool bVar23;
  byte bVar24;
  ulong uVar25;
  int vertex_count;
  long lVar26;
  bool bVar27;
  bool bVar28;
  uint uVar29;
  bool bVar30;
  int face_count;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  double dVar39;
  double dVar40;
  ON_SHA1_Hash this_mesh_mp_hash;
  ON_SHA1_Hash mp_hash;
  uint local_168;
  uint local_134;
  ON_MeshParameters *local_130;
  bool local_120;
  double local_cc;
  double dStack_c4;
  ON__UINT8 local_bc [4];
  double local_b8;
  double dStack_b0;
  ON__UINT8 local_a8 [16];
  undefined1 local_98 [16];
  ON_Interval local_88;
  ON_Interval local_78;
  ON_Interval local_68;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  
  if (meshes == (ON_Mesh **)0x0 || mesh_count < 1) {
    return;
  }
  uVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (((int)uVar2 < 1) && (-1 < (this->m_F).m_capacity)) {
    (this->m_F).m_count = 0;
  }
  uVar13 = (this->m_F).m_count;
  bVar28 = true;
  bVar30 = true;
  if (uVar2 != 0) {
    bVar30 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == uVar2 && 0 < (int)uVar2;
  }
  if (uVar13 != 0 && uVar2 != 0) {
    bVar28 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == uVar13 && 0 < (int)uVar13;
  }
  bVar18 = true;
  bVar23 = true;
  if (uVar2 != 0) {
    bVar23 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == uVar2 && 0 < (int)uVar2;
    bVar18 = (this->m_K).m_count == uVar2 && 0 < (int)uVar2;
  }
  bVar19 = true;
  bVar27 = true;
  if (uVar2 == 0) {
    bVar10 = true;
  }
  else {
    bVar27 = (this->m_C).m_count == uVar2 && 0 < (int)uVar2;
    bVar19 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == uVar2 && 0 < (int)uVar2;
    bVar10 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  }
  iVar12 = NgonCount(this);
  if (iVar12 < 1) {
    bVar37 = false;
  }
  else {
    puVar14 = NgonMap(this);
    bVar37 = puVar14 != (uint *)0x0;
  }
  local_a8[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
  local_a8[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
  local_a8[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
  local_a8[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
  local_b8 = (double)ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  dStack_b0 = (double)ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  bVar9 = true;
  if (uVar2 != 0) {
    local_130 = this->m_mesh_parameters;
    if (local_130 != (ON_MeshParameters *)0x0) {
      ON_MeshParameters::GeometrySettingsHash((ON_SHA1_Hash *)local_98,local_130,false);
      local_a8[0] = local_88.m_t[0]._0_1_;
      local_a8[1] = local_88.m_t[0]._1_1_;
      local_a8[2] = local_88.m_t[0]._2_1_;
      local_a8[3] = local_88.m_t[0]._3_1_;
      local_b8 = (double)local_98._0_8_;
      dStack_b0 = (double)local_98._8_8_;
      goto LAB_0050cac8;
    }
    bVar9 = false;
  }
  local_130 = (ON_MeshParameters *)0x0;
LAB_0050cac8:
  local_120 = bVar19;
  if ((uVar2 != 0) && (bVar19 == true)) {
    bVar11 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240);
    if (bVar11) {
      local_120 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250);
    }
    else {
      local_120 = false;
    }
  }
  lVar26 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)(local_98 + lVar26));
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x20);
  local_38 = (double *)&this->field_0x240;
  local_40 = (double *)&this->field_0x250;
  bVar11 = (local_120 & 0 < (int)uVar2) != 0;
  pOVar15 = &ON_Interval::EmptyInterval;
  if (bVar11) {
    pOVar15 = (ON_Interval *)local_38;
  }
  pOVar21 = &ON_Interval::EmptyInterval;
  if (bVar11) {
    pOVar21 = (ON_Interval *)local_40;
  }
  local_98._0_8_ = pOVar15->m_t[0];
  local_98._8_8_ = pOVar15->m_t[1];
  local_88.m_t[0] = pOVar21->m_t[0];
  local_88.m_t[1] = pOVar21->m_t[1];
  bVar11 = bVar23;
  if ((uVar2 != 0) && (bVar23 == true)) {
    bVar11 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x270);
    if (bVar11) {
      bVar11 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x280);
    }
    else {
      bVar11 = false;
    }
  }
  lVar26 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)local_78.m_t + lVar26));
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x20);
  local_50 = (double *)&this->field_0x270;
  local_48 = (double *)&this->field_0x280;
  bVar38 = (0 < (int)uVar2 & bVar11) != 0;
  pOVar15 = &ON_Interval::EmptyInterval;
  if (bVar38) {
    pOVar15 = (ON_Interval *)local_50;
  }
  local_78.m_t[0] = pOVar15->m_t[0];
  local_78.m_t[1] = pOVar15->m_t[1];
  pOVar15 = &ON_Interval::EmptyInterval;
  if (bVar38) {
    pOVar15 = (ON_Interval *)local_48;
  }
  local_68.m_t[0] = pOVar15->m_t[0];
  local_68.m_t[1] = pOVar15->m_t[1];
  uVar32 = 0;
  if (bVar11 != false) {
    uVar32 = *(uint *)&this->m_packed_tex_rotate;
  }
  bVar20 = (byte)uVar32;
  dVar40 = this->m_srf_scale[0];
  dVar39 = this->m_srf_scale[1];
  uVar16 = (ulong)(uint)mesh_count;
  local_168 = uVar2;
  local_134 = uVar13;
  if (0 < mesh_count) {
    uVar36 = (uint)(0 < (int)uVar2);
    uVar33 = 0;
    do {
      pOVar6 = meshes[uVar33];
      uVar35 = uVar36;
      if ((pOVar6 != (ON_Mesh *)0x0) &&
         (iVar12 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar12)) {
        if (bVar9) {
          pOVar7 = pOVar6->m_mesh_parameters;
          if (pOVar7 == (ON_MeshParameters *)0x0) {
            bVar9 = false;
          }
          else {
            ON_MeshParameters::GeometrySettingsHash((ON_SHA1_Hash *)&local_cc,pOVar7,false);
            if (local_130 == (ON_MeshParameters *)0x0) {
              local_a8[0] = local_bc[0];
              local_a8[1] = local_bc[1];
              local_a8[2] = local_bc[2];
              local_a8[3] = local_bc[3];
              local_b8 = local_cc;
              dStack_b0 = dStack_c4;
              local_130 = pOVar7;
            }
            else {
              bVar38 = ::operator!=((ON_SHA1_Hash *)&local_cc,(ON_SHA1_Hash *)&local_b8);
              if (bVar38) {
                bVar9 = false;
              }
            }
          }
        }
        bVar38 = false;
        iVar3 = (pOVar6->m_F).m_count;
        iVar31 = 0;
        if (0 < iVar3) {
          iVar31 = iVar3;
        }
        if (bVar30 != false) {
          iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          if ((pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar4) {
            bVar30 = bVar38;
          }
          if (iVar4 < 1) {
            bVar30 = bVar38;
          }
        }
        if (bVar23 != false) {
          iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          if ((pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar4) {
            bVar23 = bVar38;
          }
          if (iVar4 < 1) {
            bVar23 = bVar38;
          }
        }
        if (bVar18 != false) {
          iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          if ((pOVar6->m_K).m_count != iVar4) {
            bVar18 = bVar38;
          }
          if (iVar4 < 1) {
            bVar18 = bVar38;
          }
        }
        if (bVar27 != false) {
          iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          if ((pOVar6->m_C).m_count != iVar4) {
            bVar27 = bVar38;
          }
          if (iVar4 < 1) {
            bVar27 = bVar38;
          }
        }
        if (bVar19 != false) {
          iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          if ((pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count != iVar4) {
            bVar19 = false;
          }
          if (iVar4 < 1) {
            bVar19 = bVar38;
          }
        }
        if ((bVar10 != false) &&
           (bVar38 = HasSynchronizedDoubleAndSinglePrecisionVertices(pOVar6), !bVar38)) {
          bVar10 = false;
        }
        if ((0 < iVar3) && (bVar28)) {
          iVar3 = (pOVar6->m_F).m_count;
          if ((pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count != iVar3) {
            bVar28 = false;
          }
          if (iVar3 < 1) {
            bVar28 = false;
          }
        }
        if (local_120 != false) {
          if (bVar19 == false) {
            local_120 = false;
          }
          else {
            bVar38 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x240);
            if (bVar38) {
              local_120 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x250);
            }
            else {
              local_120 = false;
            }
          }
          if (local_120 != false) {
            ON_Interval::Union((ON_Interval *)local_98,(ON_Interval *)&pOVar6->field_0x240);
            ON_Interval::Union(&local_88,(ON_Interval *)&pOVar6->field_0x250);
          }
        }
        dVar39 = 0.0;
        if ((uVar36 == 0) && (bVar19 != false)) {
          dVar40 = 0.0;
          if (local_120 != false) {
            dVar40 = pOVar6->m_srf_scale[0];
            dVar39 = pOVar6->m_srf_scale[1];
          }
        }
        else {
          dVar40 = 0.0;
        }
        uVar35 = uVar36 + 1;
        local_134 = local_134 + iVar31;
        local_168 = local_168 + iVar12;
        if (bVar11 != false) {
          bVar38 = false;
          if (bVar23 != false) {
            bVar11 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x270);
            if (bVar11) {
              bVar38 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x280);
            }
            else {
              bVar38 = false;
            }
          }
          bVar24 = (byte)uVar32 & 1;
          uVar5 = *(uint *)&pOVar6->m_packed_tex_rotate;
          bVar20 = (byte)uVar5;
          bVar11 = bVar38;
          if (bVar24 != bVar20) {
            bVar11 = false;
          }
          uVar29 = uVar32 & 0xff;
          uVar32 = uVar29;
          if (uVar2 == 0 && (int)uVar33 == 0) {
            uVar32 = uVar5;
            bVar11 = bVar38;
          }
          if (bVar24 == bVar20) {
            uVar32 = uVar29;
          }
          if (bVar11 == true) {
            bVar38 = bVar11;
            if (((byte)uVar32 & 1) != bVar20) {
              bVar38 = false;
            }
            if (uVar36 != 0) {
              uVar5 = uVar32;
              bVar11 = bVar38;
            }
            uVar32 = uVar5 & 0xff;
            ON_Interval::Union(&local_78,(ON_Interval *)&pOVar6->field_0x270);
            ON_Interval::Union(&local_68,(ON_Interval *)&pOVar6->field_0x280);
          }
        }
      }
      uVar36 = uVar35;
      bVar20 = (byte)uVar32;
      uVar33 = uVar33 + 1;
    } while (uVar16 != uVar33);
  }
  if (((int)uVar2 < (int)local_168) || ((int)uVar13 < (int)local_134)) {
    if ((local_120 & bVar19) == 0) {
      local_98._0_8_ = ON_Interval::EmptyInterval.m_t[0];
      local_98._8_8_ = ON_Interval::EmptyInterval.m_t[1];
      local_88.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_88.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      dVar39 = 0.0;
      dVar40 = 0.0;
    }
    if ((bVar11 & bVar23) == 0) {
      local_78.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_78.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      local_68.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_68.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      bVar20 = 0;
    }
    *local_38 = (double)local_98._0_8_;
    local_38[1] = (double)local_98._8_8_;
    *local_40 = local_88.m_t[0];
    local_40[1] = local_88.m_t[1];
    this->m_srf_scale[0] = dVar40;
    this->m_srf_scale[1] = dVar39;
    *local_50 = local_78.m_t[0];
    local_50[1] = local_78.m_t[1];
    *local_48 = local_68.m_t[0];
    local_48[1] = local_68.m_t[1];
    this->m_packed_tex_rotate = (bool)(bVar20 & 1);
    ON_MeshTopology::Destroy(&this->m_top);
    new_capacity = (size_t)(int)local_168;
    if ((uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < local_168) {
      ON_SimpleArray<ON_3fPoint>::SetCapacity
                (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,new_capacity);
    }
    if ((uint)(this->m_F).m_capacity < local_134) {
      ON_SimpleArray<ON_MeshFace>::SetCapacity(&this->m_F,(long)(int)local_134);
    }
    if (0 < mesh_count) {
      uVar33 = 0;
      do {
        pOVar6 = meshes[uVar33];
        if ((pOVar6 != (ON_Mesh *)0x0) &&
           (iVar12 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar12)) {
          iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          iVar31 = (this->m_F).m_count;
          lVar26 = (long)iVar31;
          iVar4 = (pOVar6->m_F).m_count;
          if (0 < iVar4) {
            ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,iVar4,(pOVar6->m_F).m_a);
            piVar22 = (this->m_F).m_a[lVar26].vi + 3;
            do {
              ((ON_MeshFace *)(piVar22 + -3))->vi[0] =
                   ((ON_MeshFace *)(piVar22 + -3))->vi[0] + iVar3;
              piVar22[-2] = piVar22[-2] + iVar3;
              piVar22[-1] = piVar22[-1] + iVar3;
              *piVar22 = *piVar22 + iVar3;
              lVar26 = lVar26 + 1;
              piVar22 = piVar22 + 4;
            } while (lVar26 < iVar31 + iVar4);
          }
          ON_SimpleArray<ON_3fPoint>::Append
                    (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,iVar12,
                     (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
          if ((0 < (pOVar6->m_F).m_count) && ((pOVar6->m_Ngon).m_count != 0)) {
            puVar14 = NgonMap(pOVar6);
            if (puVar14 != (uint *)0x0) {
              bVar37 = true;
            }
            ON_SimpleArray<unsigned_int>::SetCapacity(&this->m_NgonMap,0);
            uVar13 = NgonUnsignedCount(pOVar6);
            if (uVar13 != 0) {
              uVar32 = 0;
              do {
                pOVar17 = Ngon(pOVar6,uVar32);
                if ((pOVar17 != (ON_MeshNgon *)0x0) &&
                   (((pOVar17->m_Vcount != 0 || (pOVar17->m_Fcount != 0)) &&
                    (pOVar17 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,pOVar17),
                    pOVar17 != (ON_MeshNgon *)0x0)))) {
                  if (pOVar17->m_Vcount != 0) {
                    puVar14 = pOVar17->m_vi;
                    uVar25 = 0;
                    do {
                      puVar14[uVar25] = puVar14[uVar25] + iVar3;
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < pOVar17->m_Vcount);
                  }
                  if (pOVar17->m_Fcount != 0) {
                    puVar14 = pOVar17->m_fi;
                    uVar25 = 0;
                    do {
                      puVar14[uVar25] = puVar14[uVar25] + iVar31;
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < pOVar17->m_Fcount);
                  }
                  AddNgon(this,pOVar17);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar13);
            }
          }
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar16);
    }
    if (bVar10 != false) {
      if ((uint)(this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < local_168) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity
                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if ((pOVar6 != (ON_Mesh *)0x0) &&
             (iVar12 = (pOVar6->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count, 0 < iVar12)) {
            ON_SimpleArray<ON_3dPoint>::Append
                      (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,iVar12,
                       (pOVar6->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
      if ((this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count != local_168) {
        bVar10 = false;
      }
    }
    if (bVar10 == false) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
    }
    pOVar1 = &this->m_N;
    if (bVar30 == false) {
      ON_SimpleArray<ON_3fVector>::SetCapacity(&pOVar1->super_ON_SimpleArray<ON_3fVector>,0);
    }
    else {
      if ((uint)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_168) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&pOVar1->super_ON_SimpleArray<ON_3fVector>,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if (pOVar6 != (ON_Mesh *)0x0) {
            ON_SimpleArray<ON_3fVector>::Append
                      (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                       (pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_count,
                       (pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    pOVar1 = &this->m_FN;
    if (bVar28) {
      if ((uint)(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_134) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&pOVar1->super_ON_SimpleArray<ON_3fVector>,(long)(int)local_134);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if ((pOVar6 != (ON_Mesh *)0x0) &&
             (0 < (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
            ON_SimpleArray<ON_3fVector>::Append
                      (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                       (pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count,
                       (pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    else {
      ON_SimpleArray<ON_3fVector>::SetCapacity(&pOVar1->super_ON_SimpleArray<ON_3fVector>,0);
    }
    this_00 = &this->m_T;
    if (bVar23 == false) {
      ON_SimpleArray<ON_2fPoint>::SetCapacity(&this_00->super_ON_SimpleArray<ON_2fPoint>,0);
    }
    else {
      if ((uint)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < local_168) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&this_00->super_ON_SimpleArray<ON_2fPoint>,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if (pOVar6 != (ON_Mesh *)0x0) {
            ON_SimpleArray<ON_2fPoint>::Append
                      (&this_00->super_ON_SimpleArray<ON_2fPoint>,
                       (pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count,
                       (pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    this_01 = &this->m_S;
    if (bVar19 == false) {
      ON_SimpleArray<ON_2dPoint>::SetCapacity(&this_01->super_ON_SimpleArray<ON_2dPoint>,0);
    }
    else {
      if ((uint)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < local_168) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&this_01->super_ON_SimpleArray<ON_2dPoint>,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if (pOVar6 != (ON_Mesh *)0x0) {
            ON_SimpleArray<ON_2dPoint>::Append
                      (&this_01->super_ON_SimpleArray<ON_2dPoint>,
                       (pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count,
                       (pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    this_02 = &this->m_K;
    if (bVar18 == false) {
      ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(this_02,0);
    }
    else {
      if ((uint)(this->m_K).m_capacity < local_168) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(this_02,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if (pOVar6 != (ON_Mesh *)0x0) {
            ON_SimpleArray<ON_SurfaceCurvature>::Append
                      (this_02,(pOVar6->m_K).m_count,(pOVar6->m_K).m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    this_03 = &this->m_C;
    if (bVar27 == false) {
      ON_SimpleArray<ON_Color>::SetCapacity(this_03,0);
    }
    else {
      if ((uint)(this->m_C).m_capacity < local_168) {
        ON_SimpleArray<ON_Color>::SetCapacity(this_03,new_capacity);
      }
      if (0 < mesh_count) {
        uVar33 = 0;
        do {
          pOVar6 = meshes[uVar33];
          if (pOVar6 != (ON_Mesh *)0x0) {
            ON_SimpleArray<ON_Color>::Append(this_03,(pOVar6->m_C).m_count,(pOVar6->m_C).m_a);
          }
          uVar33 = uVar33 + 1;
        } while (uVar16 != uVar33);
      }
    }
    if (0 < mesh_count && this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      uVar33 = 0;
      do {
        if ((meshes[uVar33] != (ON_Mesh *)0x0) &&
           ((pOVar7 = meshes[uVar33]->m_mesh_parameters, pOVar7 == (ON_MeshParameters *)0x0 ||
            (iVar12 = ON_MeshParameters::Compare(this->m_mesh_parameters,pOVar7), iVar12 != 0)))) {
          if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
            operator_delete(this->m_mesh_parameters,0xe0);
          }
          this->m_mesh_parameters = (ON_MeshParameters *)0x0;
          break;
        }
        uVar33 = uVar33 + 1;
      } while (uVar16 != uVar33);
    }
    lVar26 = 0xd7;
    do {
      this_04 = (ON_MeshCurvatureStats *)
                (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar26];
      if (this_04 != (ON_MeshCurvatureStats *)0x0) {
        ON_MeshCurvatureStats::~ON_MeshCurvatureStats(this_04);
        operator_delete(this_04,0x40);
        (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar26] = (_func_int **)0x0;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0xdb);
    if (0 < mesh_count) {
      bVar28 = uVar2 == 0;
      uVar33 = 0;
      do {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          if (bVar28) {
            ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&pOVar6->m_TC);
            bVar28 = false;
          }
          else if (0 < (this->m_TC).m_count) {
            iVar12 = 0;
            do {
              if ((pOVar6->m_TC).m_count < 1) {
LAB_0050d816:
                ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,iVar12);
                iVar12 = iVar12 + -1;
              }
              else {
                lVar26 = 0;
                lVar34 = 0;
                bVar30 = false;
                do {
                  bVar23 = ::operator==(&(this->m_TC).m_a[iVar12].m_tag,
                                        (ON_MappingTag *)
                                        ((((pOVar6->m_TC).m_a)->m_tag).m_mapping_id.Data4 +
                                        lVar26 + -8));
                  if (bVar23) {
                    pOVar8 = (pOVar6->m_TC).m_a;
                    ON_SimpleArray<ON_3fPoint>::Append
                              (&(this->m_TC).m_a[iVar12].m_T,
                               *(int *)((long)&(pOVar8->m_T).m_count + lVar26),
                               *(ON_3fPoint **)((long)&(pOVar8->m_T).m_a + lVar26));
                    bVar30 = true;
                  }
                  lVar34 = lVar34 + 1;
                  lVar26 = lVar26 + 0xb8;
                } while (lVar34 < (pOVar6->m_TC).m_count);
                if (!bVar30) goto LAB_0050d816;
              }
              iVar12 = iVar12 + 1;
            } while (iVar12 < (this->m_TC).m_count);
          }
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar16);
    }
    this->m_mesh_is_closed = '\0';
    this->m_mesh_is_manifold = '\0';
    this->m_mesh_is_oriented = '\0';
    this->m_mesh_is_solid = '\0';
    InvalidateBoundingBoxes(this);
    iVar12 = NgonCount(this);
    if ((0 < iVar12) && (bVar37)) {
      CreateNgonMap(this);
    }
    if (((bVar9) && (local_130 != (ON_MeshParameters *)0x0)) &&
       (local_130 != this->m_mesh_parameters)) {
      SetMeshParameters(this,local_130);
    }
  }
  return;
}

Assistant:

void ON_Mesh::Append(int mesh_count, const ON_Mesh* const* meshes)
{
  if (mesh_count <= 0 || 0 == meshes)
    return;

  int mi;
  int vcount0 = VertexCount();
  if (vcount0 <= 0)
    m_F.SetCount(0);
  int fcount0 = FaceCount();
  int* vi;
  int j;
  const ON_Mesh* m;

  // The calls to Has*() must happen before the m_V[] and m_F[] arrays get enlarged
  // Allow the appendage of VertexNormals, TextureCoordinates, PrincipalCurvatures to empty meshes
  // by checking for 0 == vcount0 && 0 == fcount0
  bool bHasVertexNormals = (0 == vcount0 || HasVertexNormals());
  bool bHasFaceNormals = (0 == vcount0 || 0 == fcount0 || HasFaceNormals());
  bool bHasTextureCoordinates = (0 == vcount0 || HasTextureCoordinates());
  bool bHasPrincipalCurvatures = (0 == vcount0 || HasPrincipalCurvatures());
  bool bHasVertexColors = (0 == vcount0 || HasVertexColors());
  bool bHasSurfaceParameters = (0 == vcount0 || HasSurfaceParameters());
  bool bHasDoubles = (0 == vcount0 || HasSynchronizedDoubleAndSinglePrecisionVertices());
  bool bHasNgonMap = (NgonCount() > 0 && 0 != NgonMap());

  bool bSetMeshParameters = true;
  const ON_MeshParameters* mp = nullptr;
  ON_SHA1_Hash mp_hash = ON_SHA1_Hash::EmptyContentHash;
  if (0 != vcount0)
  {
    mp = this->MeshParameters();
    if (nullptr == mp)
      bSetMeshParameters = false;
    else
      mp_hash = mp->GeometrySettingsHash();
  }

  bool bHasSurfaceDomain
    = bHasSurfaceParameters
    && (0 == vcount0 || (m_srf_domain[0].IsIncreasing() && m_srf_domain[1].IsIncreasing()));

  ON_Interval srf_domain[2];
  srf_domain[0] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[0] : ON_Interval::EmptyInterval;
  srf_domain[1] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[1] : ON_Interval::EmptyInterval;

  bool bHasTexturePackingDomain
    = bHasTextureCoordinates
    && (0 == vcount0 || (m_packed_tex_domain[0].IsIncreasing() && m_packed_tex_domain[1].IsIncreasing()));

  ON_Interval packed_tex_domain[2];
  packed_tex_domain[0] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[0] : ON_Interval::EmptyInterval;
  packed_tex_domain[1] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[1] : ON_Interval::EmptyInterval;
  bool packed_tex_rotate = (bHasTexturePackingDomain && m_packed_tex_rotate) ? true : false;

  double srf_scale[2] = { m_srf_scale[0], m_srf_scale[1] };

  int fcount = fcount0;
  int vcount = vcount0;
  unsigned int merged_count = vcount0 > 0 ? 1 : 0;
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;

    merged_count++;

    if (bSetMeshParameters)
    {
      const ON_MeshParameters* this_mesh_mp = m->MeshParameters();
      if (nullptr == this_mesh_mp)
        bSetMeshParameters = false;
      else
      {
        const ON_SHA1_Hash this_mesh_mp_hash = this_mesh_mp->GeometrySettingsHash();
        if (nullptr == mp)
        {
          // first mesh parameters.
          mp = this_mesh_mp;
          mp_hash = this_mesh_mp_hash;
        }
        else
        {
          if (this_mesh_mp_hash != mp_hash)
          {
            // variable mesh paramters - means output gets none.
            bSetMeshParameters = false;
          }
        }
      }
    }

    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
      fcount += fcount1;
    vcount += vcount1;
    if (bHasVertexNormals && !m->HasVertexNormals())
      bHasVertexNormals = false;
    if (bHasTextureCoordinates && !m->HasTextureCoordinates())
      bHasTextureCoordinates = false;
    if (bHasPrincipalCurvatures && !m->HasPrincipalCurvatures())
      bHasPrincipalCurvatures = false;
    if (bHasVertexColors && !m->HasVertexColors())
      bHasVertexColors = false;
    if (bHasSurfaceParameters && !m->HasSurfaceParameters())
      bHasSurfaceParameters = false;
    if (bHasDoubles && !m->HasSynchronizedDoubleAndSinglePrecisionVertices())
      bHasDoubles = false;
    if (bHasFaceNormals && fcount1 > 0 && !m->HasFaceNormals())
      bHasFaceNormals = false;

    if (bHasSurfaceDomain)
    {
      bHasSurfaceDomain
        = bHasSurfaceParameters
        && m->m_srf_domain[0].IsIncreasing()
        && m->m_srf_domain[1].IsIncreasing();
      if (bHasSurfaceDomain)
      {
        srf_domain[0].Union(m->m_srf_domain[0]);
        srf_domain[1].Union(m->m_srf_domain[1]);
      }
    }

    if (1 == merged_count && bHasSurfaceParameters && bHasSurfaceDomain)
    {
      srf_scale[0] = m->m_srf_scale[0];
      srf_scale[1] = m->m_srf_scale[1];
    }
    else
    {
      srf_scale[0] = 0.0;
      srf_scale[1] = 0.0;
    }

    if (bHasTexturePackingDomain)
    {
      // 2014-04-01 Dale Lear
      //   Trying to merger packed_tex_domain[] intervals
      //   is questionable at best.
      //   A strong argument can be made for simply deleting
      //   packed texture domain information when there are
      //   two non-empty meshes that are merged.
      bHasTexturePackingDomain
        = bHasTextureCoordinates
        && m->m_packed_tex_domain[0].IsIncreasing()
        && m->m_packed_tex_domain[1].IsIncreasing();
      if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
      {
        if (0 == vcount0 && 0 == mi)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else
        {
          bHasTexturePackingDomain = false;
        }
      }
      if (bHasTexturePackingDomain)
      {
        if (1 == merged_count)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
        {
          bHasTexturePackingDomain = false;
        }
        packed_tex_domain[0].Union(m->m_packed_tex_domain[0]);
        packed_tex_domain[1].Union(m->m_packed_tex_domain[1]);
      }
    }
  }


  if (vcount <= vcount0 && fcount <= fcount0)
    return;

  if (!bHasSurfaceParameters || !bHasSurfaceDomain)
  {
    srf_domain[0] = ON_Interval::EmptyInterval;
    srf_domain[1] = ON_Interval::EmptyInterval;
    srf_scale[0] = 0.0;
    srf_scale[1] = 0.0;
  }

  if (!bHasTextureCoordinates || !bHasTexturePackingDomain)
  {
    packed_tex_domain[0] = ON_Interval::EmptyInterval;
    packed_tex_domain[1] = ON_Interval::EmptyInterval;
    packed_tex_rotate = false;
  }

  m_srf_domain[0] = srf_domain[0];
  m_srf_domain[1] = srf_domain[1];
  m_srf_scale[0] = srf_scale[0];
  m_srf_scale[1] = srf_scale[1];

  m_packed_tex_domain[0] = packed_tex_domain[0];
  m_packed_tex_domain[1] = packed_tex_domain[1];
  m_packed_tex_rotate = packed_tex_rotate;

  m_top.Destroy();

  // It is critical to call DoublePrecisionVertices() before 
  // we modify m_V[] because DoublePrecisionVertices() will
  // attempt to update the double precision information
  // when it notices that m_V has new vertices added.

  m_V.Reserve(vcount);
  m_F.Reserve(fcount);
  for (mi = 0; mi < mesh_count; mi++)
  {
    const unsigned int vcount0_local = m_V.UnsignedCount();
    const unsigned int fcount0_local = m_F.UnsignedCount();
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;
    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
    {
      j = m_F.Count();
      m_F.Append(fcount1, m->m_F.Array());
      fcount1 += j;
      while (j < fcount1)
      {
        vi = m_F[j].vi;
        vi[0] += (int)vcount0_local;
        vi[1] += (int)vcount0_local;
        vi[2] += (int)vcount0_local;
        vi[3] += (int)vcount0_local;
        j++;
      }
    }
    m_V.Append(vcount1, m->m_V.Array());
    if (m->HasNgons())
    {
      if (0 != m->NgonMap())
        bHasNgonMap = true;
      m_NgonMap.Destroy();
      unsigned int ngon_count = m->NgonUnsignedCount();
      for (unsigned int ni = 0; ni < ngon_count; ni++)
      {
        const ON_MeshNgon* ngon0 = m->Ngon(ni);
        if (0 == ngon0)
          continue;
        if (0 == ngon0->m_Vcount && 0 == ngon0->m_Fcount)
          continue;
        ON_MeshNgon* ngon1 = this->m_NgonAllocator.CopyNgon(ngon0);
        if (0 == ngon1)
          continue;
        for (unsigned int nvi = 0; nvi < ngon1->m_Vcount; nvi++)
        {
          ngon1->m_vi[nvi] += vcount0_local;
        }
        for (unsigned int nfi = 0; nfi < ngon1->m_Fcount; nfi++)
        {
          ngon1->m_fi[nfi] += fcount0_local;
        }
        this->AddNgon(ngon1);
      }
    }
  }

  if (bHasDoubles)
  {
    // Now update the double precision vertex locations.
    m_dV.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_dV.Count() <= 0)
        continue;
      m_dV.Append(m->m_dV.Count(), m->m_dV.Array());
    }
    if (m_dV.Count() != vcount)
      bHasDoubles = false;
  }

  if (false == bHasDoubles)
  {
    bHasDoubles = false;
    DestroyDoublePrecisionVertices();
  }

  if (bHasVertexNormals)
  {
    m_N.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_N.Append(m->m_N.Count(), m->m_N.Array());
    }
  }
  else
  {
    m_N.Destroy();
  }


  if (bHasFaceNormals)
  {
    m_FN.Reserve(fcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_V.Count() <= 0)
        continue;
      m_FN.Append(m->m_FN.Count(), m->m_FN.Array());
    }
  }
  else
  {
    m_FN.Destroy();
  }

  if (bHasTextureCoordinates)
  {
    m_T.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_T.Append(m->m_T.Count(), m->m_T.Array());
    }
  }
  else
  {
    m_T.Destroy();
  }


  if (bHasSurfaceParameters)
  {
    m_S.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_S.Append(m->m_S.Count(), m->m_S.Array());
    }
  }
  else
  {
    m_S.Destroy();
  }

  if (bHasPrincipalCurvatures)
  {
    m_K.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_K.Append(m->m_K.Count(), m->m_K.Array());
    }
  }
  else
  {
    m_K.Destroy();
  }

  if (bHasVertexColors)
  {
    m_C.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_C.Append(m->m_C.Count(), m->m_C.Array());
    }
  }
  else
  {
    m_C.Destroy();
  }

  if (0 != m_mesh_parameters)
  {
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      if (0 == m->m_mesh_parameters || *m_mesh_parameters != *m->m_mesh_parameters)
      {
        delete m_mesh_parameters;
        m_mesh_parameters = 0;
        break;
      }
    }
  }

  for (j = 0; j < 4; j++)
  {
    if (m_kstat[j])
    {
      // will be recomputed if required
      delete m_kstat[j];
      m_kstat[j] = 0;
    }
  }

  bool bAllowNewCachedTCs = (vcount0 == 0);
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;

    if (bAllowNewCachedTCs)
    {
      m_TC = m->m_TC;
      bAllowNewCachedTCs = false;
    }
    else
    {
      for (int tci = 0; tci < m_TC.Count(); tci++)
      {
        bool bKeep = false;
        for (int tcimi = 0; tcimi < m->m_TC.Count(); tcimi++)
        {
          if (m_TC[tci].m_tag == m->m_TC[tcimi].m_tag)
          {
            m_TC[tci].m_T.Append(m->m_TC[tcimi].m_T.Count(), m->m_TC[tcimi].m_T.Array());
            bKeep = true;
          }
        }
        if (!bKeep)
        {
          m_TC.Remove(tci);
          tci--;
        }
      }
    }
  }

  SetClosed(-99);
  SetSolidOrientation(-99);
  InvalidateBoundingBoxes();

  if (NgonCount() > 0 && bHasNgonMap)
    CreateNgonMap();

  if (bSetMeshParameters && nullptr != mp && mp != this->MeshParameters())
  {
    // Appending to an empty this and all appendees have matching mesh parameters.
    this->SetMeshParameters(*mp);
  }
}